

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O3

void __thiscall highs::parallel::TaskGroup::~TaskGroup(TaskGroup *this)

{
  ulong *puVar1;
  long lVar2;
  HighsSplitDeque *pHVar3;
  long lVar4;
  
  lVar2 = (long)this->dequeHead;
  pHVar3 = this->workerDeque;
  if (this->dequeHead < (int)(pHVar3->ownerData).head) {
    lVar4 = lVar2 * 0x40 + 0x138;
    do {
      LOCK();
      puVar1 = (ulong *)((long)&(pHVar3->ownerData).workerBunk.
                                super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + lVar4);
      *puVar1 = *puVar1 | 2;
      UNLOCK();
      lVar2 = lVar2 + 1;
      pHVar3 = this->workerDeque;
      lVar4 = lVar4 + 0x40;
    } while (lVar2 < (int)(pHVar3->ownerData).head);
  }
  taskWait(this);
  return;
}

Assistant:

~TaskGroup() {
    cancel();
    taskWait();
  }